

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O2

ma_result ma_rb_commit_read(ma_rb *pRB,size_t sizeInBytes)

{
  ma_result mVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  
  mVar1 = MA_INVALID_ARGS;
  if (pRB != (ma_rb *)0x0) {
    uVar4 = (int)sizeInBytes + (pRB->encodedReadOffset & 0x7fffffff);
    if (uVar4 <= pRB->subbufferSizeInBytes) {
      uVar2 = pRB->encodedReadOffset & 0x80000000;
      uVar3 = uVar2 | uVar4;
      if (uVar4 == pRB->subbufferSizeInBytes) {
        uVar3 = uVar2 ^ 0x80000000;
      }
      LOCK();
      pRB->encodedReadOffset = uVar3;
      UNLOCK();
      mVar1 = MA_SUCCESS;
    }
  }
  return mVar1;
}

Assistant:

MA_API ma_result ma_rb_commit_read(ma_rb* pRB, size_t sizeInBytes)
{
    ma_uint32 readOffset;
    ma_uint32 readOffsetInBytes;
    ma_uint32 readOffsetLoopFlag;
    ma_uint32 newReadOffsetInBytes;
    ma_uint32 newReadOffsetLoopFlag;

    if (pRB == NULL) {
        return MA_INVALID_ARGS;
    }

    readOffset = ma_atomic_load_32(&pRB->encodedReadOffset);
    ma_rb__deconstruct_offset(readOffset, &readOffsetInBytes, &readOffsetLoopFlag);

    /* Check that sizeInBytes is correct. It should never go beyond the end of the buffer. */
    newReadOffsetInBytes = (ma_uint32)(readOffsetInBytes + sizeInBytes);
    if (newReadOffsetInBytes > pRB->subbufferSizeInBytes) {
        return MA_INVALID_ARGS;    /* <-- sizeInBytes will cause the read offset to overflow. */
    }

    /* Move the read pointer back to the start if necessary. */
    newReadOffsetLoopFlag = readOffsetLoopFlag;
    if (newReadOffsetInBytes == pRB->subbufferSizeInBytes) {
        newReadOffsetInBytes = 0;
        newReadOffsetLoopFlag ^= 0x80000000;
    }

    ma_atomic_exchange_32(&pRB->encodedReadOffset, ma_rb__construct_offset(newReadOffsetInBytes, newReadOffsetLoopFlag));

    return MA_SUCCESS;
}